

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O1

int __thiscall
kj::anon_unknown_0::TestCase1772::run::MockEventPort::poll
          (MockEventPort *this,pollfd *__fds,nfds_t __nfds,int __timeout)

{
  PromiseFulfiller<void> *pPVar1;
  Disposer *pDVar2;
  char c;
  undefined1 local_a;
  char local_9;
  
  this->pollStack = &local_9;
  if ((this->fulfiller).ptr.ptr != (PromiseFulfiller<void> *)0x0) {
    pPVar1 = (this->fulfiller).ptr.ptr;
    (*(pPVar1->super_PromiseRejector)._vptr_PromiseRejector[2])(pPVar1,&local_a);
    pDVar2 = (this->fulfiller).ptr.disposer;
    pPVar1 = (this->fulfiller).ptr.ptr;
    (this->fulfiller).ptr.disposer = (Disposer *)0x0;
    (this->fulfiller).ptr.ptr = (PromiseFulfiller<void> *)0x0;
    if (pPVar1 != (PromiseFulfiller<void> *)0x0) {
      (**pDVar2->_vptr_Disposer)
                (pDVar2,(pPVar1->super_PromiseRejector)._vptr_PromiseRejector[-2] +
                        (long)&(pPVar1->super_PromiseRejector)._vptr_PromiseRejector);
    }
  }
  return 0;
}

Assistant:

bool poll() override {
      char c;
      pollStack = &c;
      KJ_IF_SOME(f, fulfiller) {
        f->fulfill();
        fulfiller = kj::none;
      }
      return false;
    }